

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

EnvNAVXYTHETALATHashEntry_t * __thiscall
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup
          (EnvironmentNAVXYTHETALAT *this,int X,int Y,int Theta)

{
  EnvNAVXYTHETALATHashEntry_t *pEVar1;
  size_type sVar2;
  reference ppiVar3;
  char *what_arg;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  value_type *in_RDI;
  int *entry;
  int index;
  EnvNAVXYTHETALATHashEntry_t *HashEntry;
  int i;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
  *in_stack_ffffffffffffffc0;
  int local_18;
  
  pEVar1 = (EnvNAVXYTHETALATHashEntry_t *)operator_new(0x14);
  pEVar1->X = in_ESI;
  pEVar1->Y = in_EDX;
  pEVar1->Theta = (char)in_ECX;
  pEVar1->iteration = 0;
  sVar2 = std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
          ::size((vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
                  *)(in_RDI + 0x34));
  pEVar1->stateID = (int)sVar2;
  std::vector<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>::
  push_back(in_stack_ffffffffffffffc0,in_RDI);
  *(EnvNAVXYTHETALATHashEntry_t **)
   (&in_RDI[0x37]->stateID +
   (long)(in_ECX + in_ESI * *(int *)(in_RDI + 6) +
         in_EDX * *(int *)(in_RDI + 5) * *(int *)(in_RDI + 6)) * 2) = pEVar1;
  operator_new__(8);
  std::vector<int_*,_std::allocator<int_*>_>::push_back
            ((vector<int_*,_std::allocator<int_*>_> *)in_stack_ffffffffffffffc0,(value_type *)in_RDI
            );
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    ppiVar3 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 1),(long)pEVar1->stateID
                        );
    (*ppiVar3)[local_18] = -1;
  }
  iVar4 = pEVar1->stateID;
  sVar2 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI + 1));
  if (iVar4 != (int)sVar2 + -1) {
    what_arg = (char *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception
              ((SBPL_Exception *)CONCAT44(iVar4,in_stack_ffffffffffffffb0),what_arg);
    __cxa_throw(what_arg,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  return pEVar1;
}

Assistant:

EnvNAVXYTHETALATHashEntry_t*
EnvironmentNAVXYTHETALAT::CreateNewHashEntry_lookup(int X, int Y, int Theta)
{
    int i;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    EnvNAVXYTHETALATHashEntry_t* HashEntry = new EnvNAVXYTHETALATHashEntry_t;

    HashEntry->X = X;
    HashEntry->Y = Y;
    HashEntry->Theta = Theta;
    HashEntry->iteration = 0;

    HashEntry->stateID = StateID2CoordTable.size();

    // insert into the tables
    StateID2CoordTable.push_back(HashEntry);

    int index = XYTHETA2INDEX(X,Y,Theta);

#if DEBUG
    if (Coord2StateIDHashTable_lookup[index] != NULL) {
        throw SBPL_Exception("ERROR: creating hash entry for non-NULL hashentry");
    }
#endif

    Coord2StateIDHashTable_lookup[index] = HashEntry;

    // insert into and initialize the mappings
    int* entry = new int[NUMOFINDICES_STATEID2IND];
    StateID2IndexMapping.push_back(entry);
    for (i = 0; i < NUMOFINDICES_STATEID2IND; i++) {
        StateID2IndexMapping[HashEntry->stateID][i] = -1;
    }

    if (HashEntry->stateID != (int)StateID2IndexMapping.size() - 1) {
        throw SBPL_Exception("ERROR in Env... function: last state has incorrect stateID");
    }

#if TIME_DEBUG
    time_createhash += clock()-currenttime;
#endif

    return HashEntry;
}